

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_HitWater(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  sector_t *sec;
  char *pcVar4;
  AActor *thing;
  bool bVar5;
  bool alert;
  DVector3 local_48;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042f87a;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042f86a:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042f87a:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181a,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  thing = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (thing == (AActor *)0x0) goto LAB_0042f6f1;
    pPVar3 = (thing->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (thing->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042f87a;
    }
  }
  else {
    if (thing != (AActor *)0x0) goto LAB_0042f86a;
LAB_0042f6f1:
    thing = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_0042f8a2:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181b,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x03') {
    pcVar4 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_0042f8a2;
  }
  sec = (sector_t *)param[1].field_0.field_1.a;
  if (sec == (sector_t *)0x0) {
    NullParam("\"sec\"");
    sec = (sector_t *)param[1].field_0.field_1.a;
  }
  if (numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
LAB_0042f8ca:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181c,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0042f8ca;
  }
  if (numparam == 3) {
    pcVar4 = "(paramnum) < numparam";
LAB_0042f8f2:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181d,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0042f8f2;
  }
  if ((uint)numparam < 5) {
    pcVar4 = "(paramnum) < numparam";
LAB_0042f91a:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x181e,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_0042f91a;
  }
  local_48.X = (double)param[2].field_0.field_1.a;
  local_48.Y = (double)param[3].field_0.field_1.a;
  local_48.Z = (double)param[4].field_0.field_1.a;
  if (numparam == 5) {
    param = defaultparam->Array;
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0042f9a8:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x181f,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar5 = param[5].field_0.i != 0;
LAB_0042f7d3:
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0042f9c7:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1820,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    alert = param[6].field_0.i != 0;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0042f9a8;
    }
    bVar5 = param[5].field_0.i != 0;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_0042f7d3;
    }
    if (param[6].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0042f9c7;
    }
    alert = param[6].field_0.i != 0;
    if (numparam != 7) {
      if (param[7].field_0.field_3.Type != '\0') {
        pcVar4 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_0042f939;
      }
      goto LAB_0042f7f2;
    }
    param = defaultparam->Array;
  }
  if (param[7].field_0.field_3.Type != '\0') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0042f939:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1821,
                  "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0042f7f2:
  bVar5 = P_HitWater(thing,sec,&local_48,bVar5,alert,param[7].field_0.i != 0);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1822,
                    "int AF_AActor_HitWater(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = (uint)bVar5;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, HitWater)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_POINTER_NOT_NULL(sec, sector_t);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL_DEF(checkabove);
	PARAM_BOOL_DEF(alert);
	PARAM_BOOL_DEF(force);
	ACTION_RETURN_BOOL(P_HitWater(self, sec, DVector3(x, y, z), checkabove, alert, force));
}